

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise3D::forward
          (DeconvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  Option *in_RCX;
  void **in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int ret;
  Mat top_blob_bordered;
  int outd;
  int outh;
  int outw;
  int kernel_extent_d;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int d;
  int h;
  int w;
  int in_stack_00000280;
  int in_stack_00000284;
  Mat *in_stack_00000288;
  Mat *in_stack_00000290;
  Mat *in_stack_00000298;
  Mat *in_stack_000002a0;
  int in_stack_00000940;
  int in_stack_00000948;
  int in_stack_00000950;
  int in_stack_00000958;
  int in_stack_00000960;
  int in_stack_00000968;
  int in_stack_00000970;
  int in_stack_00000978;
  int in_stack_00000980;
  Mat *in_stack_00000988;
  Option *in_stack_00000990;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  Mat *in_stack_fffffffffffffe00;
  void **ppvVar3;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  DeconvolutionDepthWise3D *in_stack_fffffffffffffe10;
  Allocator *in_stack_fffffffffffffe30;
  void *local_170;
  int *local_168;
  void *local_160;
  undefined4 local_158;
  long *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  int local_138;
  void *local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  undefined8 local_110;
  int local_104;
  int local_100;
  int local_fc;
  Option *local_f8;
  void **local_f0;
  int local_d4;
  void **local_d0;
  void **local_c8;
  int local_b8;
  undefined4 local_b4;
  void **local_a8;
  void **local_a0;
  void **local_98;
  void **local_90;
  void **local_80;
  int local_68;
  undefined4 local_64;
  void **local_60;
  void *local_58;
  void **local_40;
  void **local_38;
  
  local_fc = *(int *)(in_RSI + 0x2c);
  local_100 = *(int *)(in_RSI + 0x30);
  local_104 = *(int *)(in_RSI + 0x34);
  local_110 = *(undefined8 *)(in_RSI + 0x10);
  local_114 = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_118 = *(int *)(in_RDI + 0xe4) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_11c = *(int *)(in_RDI + 0xe8) * (*(int *)(in_RDI + 0xdc) + -1) + 1;
  local_120 = (local_fc + -1) * *(int *)(in_RDI + 0xec) + local_114 + *(int *)(in_RDI + 0x110);
  local_124 = (local_100 + -1) * *(int *)(in_RDI + 0xf0) + local_118 + *(int *)(in_RDI + 0x114);
  local_128 = (local_104 + -1) * *(int *)(in_RDI + 0xf4) + local_11c + *(int *)(in_RDI + 0x118);
  local_d0 = &local_170;
  local_170 = (void *)0x0;
  local_168 = (int *)0x0;
  local_160 = (void *)0x0;
  local_158 = 0;
  local_150 = (long *)0x0;
  local_148 = 0;
  local_144 = 0;
  local_140 = 0;
  local_13c = 0;
  local_138 = 0;
  local_130 = (void *)0x0;
  local_f8 = in_RCX;
  local_f0 = in_RDX;
  if (((((*(int *)(in_RDI + 0xf8) < 1) && (*(int *)(in_RDI + 0xfc) < 1)) &&
       (*(int *)(in_RDI + 0x100) < 1)) &&
      ((*(int *)(in_RDI + 0x104) < 1 && (*(int *)(in_RDI + 0x108) < 1)))) &&
     ((*(int *)(in_RDI + 0x10c) < 1 &&
      (((*(int *)(in_RDI + 0x11c) < 1 || (*(int *)(in_RDI + 0x120) < 1)) ||
       (*(int *)(in_RDI + 0x124) < 1)))))) {
    local_a8 = &local_170;
    if (local_a8 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_b4 = 1;
        LOCK();
        local_b8 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_170 = *in_RDX;
      local_168 = (int *)in_RDX[1];
      local_160 = in_RDX[2];
      local_158 = *(undefined4 *)(in_RDX + 3);
      local_150 = (long *)in_RDX[4];
      local_148 = *(undefined4 *)(in_RDX + 5);
      local_144 = *(undefined4 *)((long)in_RDX + 0x2c);
      local_140 = *(undefined4 *)(in_RDX + 6);
      local_13c = *(undefined4 *)((long)in_RDX + 0x34);
      local_138 = *(int *)(in_RDX + 7);
      local_130 = in_RDX[8];
      local_80 = local_a8;
    }
    local_a0 = local_a8;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                in_stack_fffffffffffffdc0,
                CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                in_stack_fffffffffffffe30);
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                in_stack_fffffffffffffdc0,
                CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                in_stack_fffffffffffffe30);
  }
  local_90 = &local_170;
  if (local_170 != (void *)0x0) {
    local_40 = local_90;
  }
  if (local_170 != (void *)0x0 && (long)local_130 * (long)local_138 != 0) {
    local_d4 = deconvolutiondepthwise3d
                         (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288,
                          in_stack_00000284,in_stack_00000280,in_stack_00000940,in_stack_00000948,
                          in_stack_00000950,in_stack_00000958,in_stack_00000960,in_stack_00000968,
                          in_stack_00000970,in_stack_00000978,in_stack_00000980,in_stack_00000988,
                          in_stack_00000990);
    if (local_d4 == 0) {
      cut_padding(in_stack_fffffffffffffe10,
                  (Mat *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                  in_stack_fffffffffffffe00,local_f8);
      local_98 = local_f0;
      bVar2 = true;
      if (*local_f0 != (void *)0x0) {
        local_38 = local_f0;
        bVar2 = (long)local_f0[8] * (long)*(int *)(local_f0 + 7) == 0;
      }
      if (bVar2) {
        local_d4 = -100;
      }
      else {
        local_d4 = 0;
      }
    }
  }
  else {
    local_d4 = -100;
  }
  ppvVar3 = &local_170;
  if (local_168 != (int *)0x0) {
    local_64 = 0xffffffff;
    LOCK();
    local_68 = *local_168;
    *local_168 = *local_168 + -1;
    UNLOCK();
    if (local_68 == 1) {
      local_c8 = ppvVar3;
      local_60 = ppvVar3;
      if (local_150 == (long *)0x0) {
        local_58 = local_170;
        if (local_170 != (void *)0x0) {
          free(local_170);
        }
      }
      else {
        (**(code **)(*local_150 + 0x18))(local_150,local_170);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_d4;
}

Assistant:

int DeconvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}